

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O3

char * int2str::impl::detail<10000ull>::convert_step<char*>(number_t x,char *iter)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (x < 10000) {
    *iter = '0';
    if (x < 1000) {
      iter[1] = '0';
      if (99 < x) {
        uVar4 = (uint)((x & 0xffff) >> 2) / 0x19;
        uVar6 = (ulong)uVar4;
        iter[2] = (byte)uVar4 | 0x30;
        goto LAB_0010833b;
      }
LAB_001082ad:
      iter[2] = '0';
      if (x < 10) {
        bVar5 = (byte)x | 0x30;
        bVar2 = 0x30;
      }
      else {
        bVar5 = (byte)(((uint)x & 0xff) / 10);
        bVar2 = bVar5 | 0x30;
        bVar5 = (byte)x + bVar5 * -10 + 0x30;
      }
    }
    else {
      uVar4 = (uint)((x & 0xffff) >> 3) / 0x7d;
      iter[1] = (char)uVar4 + '0';
      uVar6 = (ulong)uVar4 * -1000 + x;
      if (99 < uVar6) {
        uVar7 = uVar6 / 100;
        iter[2] = (char)uVar7 + '0';
        goto LAB_001082e8;
      }
LAB_00108267:
      iter[2] = '0';
      if (uVar6 < 10) {
        bVar5 = (byte)uVar6 | 0x30;
        bVar2 = 0x30;
      }
      else {
        bVar5 = (byte)(((uint)uVar6 & 0xff) / 10);
        bVar2 = bVar5 | 0x30;
        bVar5 = (byte)uVar6 + bVar5 * -10 + 0x30;
      }
    }
    iter[3] = bVar2;
  }
  else {
    *iter = (char)(x / 10000) + '0';
    uVar6 = x % 10000;
    if (uVar6 < 1000) {
      iter[1] = '0';
      if (uVar6 < 100) goto LAB_00108267;
      uVar4 = (uint)(uVar6 >> 2) / 0x19;
      uVar7 = (ulong)uVar4;
      iter[2] = (byte)uVar4 | 0x30;
LAB_001082e8:
      uVar6 = uVar7 * -100 + uVar6;
      if (uVar6 < 10) {
        bVar5 = (byte)uVar6 | 0x30;
        cVar3 = '0';
      }
      else {
        cVar1 = (char)(uVar6 / 10);
        cVar3 = cVar1 + '0';
        bVar5 = (byte)uVar6 + cVar1 * -10 + 0x30;
      }
    }
    else {
      iter[1] = (char)(uVar6 / 1000) + '0';
      x = uVar6 % 1000;
      if (x < 100) goto LAB_001082ad;
      uVar6 = x / 100;
      iter[2] = (char)uVar6 + '0';
LAB_0010833b:
      uVar6 = uVar6 * -100 + x;
      if (uVar6 < 10) {
        bVar5 = (byte)uVar6 | 0x30;
        cVar3 = '0';
      }
      else {
        cVar1 = (char)(uVar6 / 10);
        cVar3 = cVar1 + '0';
        bVar5 = (byte)uVar6 + cVar1 * -10 + 0x30;
      }
    }
    iter[3] = cVar3;
  }
  iter[4] = bVar5;
  return iter + 5;
}

Assistant:

inline static Iter convert_step(number_t x, Iter iter)
    {
        if (N > x)
        {
            *iter++ = '0';
            return detail<N / 10u>::convert_step(x, iter);
        }
        auto const w = x / N;
        *iter++ = static_cast<char>('0' + w);
        return detail<N / 10u>::convert_step(x - w * N, iter);
    }